

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XcmEvents.c
# Opt level: O3

void XcmeSelectInput(XcmeContext_s *c)

{
  Display *pDVar1;
  Window WVar2;
  bool bVar3;
  undefined8 uVar4;
  Window *__ptr;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int format;
  Window *windows;
  Atom actual;
  unsigned_long left;
  unsigned_long nWindow;
  
  nWindow = 0;
  windows = (Window *)0x0;
  actual = 0;
  format = 0;
  left = 0;
  pDVar1 = c->display;
  WVar2 = c->root;
  uVar4 = XInternAtom(pDVar1,"_NET_CLIENT_LIST",0);
  XGetWindowProperty(pDVar1,WVar2,uVar4,0,0xffffffffffffffff,0,0x21,&actual,&format,&nWindow,&left,
                     &windows);
  lVar9 = left + nWindow;
  lVar7 = lVar9 << 0x20;
  if (lVar7 != 0) {
    lVar6 = 0;
    do {
      bVar3 = false;
      WVar2 = windows[lVar6];
      if (0 < (long)c->nWindows) {
        lVar5 = 0;
        do {
          if (WVar2 == c->Windows[lVar5]) {
            bVar3 = true;
          }
          lVar5 = lVar5 + 1;
        } while (c->nWindows != lVar5);
      }
      if ((c->w != WVar2) && (!bVar3)) {
        XSelectInput(c->display,WVar2,0x408000);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != (lVar7 >> 0x20) + (ulong)(lVar7 >> 0x20 == 0));
  }
  __ptr = c->Windows;
  iVar8 = (int)lVar9;
  if (c->nWindows < iVar8) {
    if (__ptr != (Window *)0x0) {
      free(__ptr);
    }
    __ptr = (Window *)malloc(lVar7 >> 0x1d);
    c->Windows = __ptr;
  }
  memcpy(__ptr,windows,lVar7 >> 0x1d);
  c->nWindows = iVar8;
  return;
}

Assistant:

void XcmeSelectInput( XcmeContext_s * c )
{
        unsigned long nWindow = 0;
        Window * windows = 0;
  Atom actual = 0;
  int format = 0;
  unsigned long left = 0, n = 0, i,j;

        XGetWindowProperty( c->display, c->root,
          XInternAtom( c->display, "_NET_CLIENT_LIST", False), 0, ~0, False, XA_WINDOW, &actual, &format,
          &nWindow, &left, (unsigned char**)&windows );
        n = (int)(nWindow + left);

        for(i = 0; i < n; ++i)
        {
          /* search of a previous observation of a particular window */
          int found = 0;
          for(j = 0; (int)j < c->nWindows; ++j)
          {
            if(windows[i] == c->Windows[j])
              found = 1;
          }

          /* other new windows but not own */
          if( c->w != windows[i] &&
              !found )
          {
            /* observe other windows */
            XSelectInput( c->display, windows[i],
                       PropertyChangeMask |  /* Xcolor properties */
                       ExposureMask );       /* Xcolor client messages */
          }
        }

        if((int)n > c->nWindows)
        {
          if(c->Windows) free(c->Windows);
          c->Windows = (Window*)malloc( sizeof(Window) * n );
        }
        memcpy( c->Windows, windows, sizeof(Window) * n );
        c->nWindows = n;
}